

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteAction(BinaryWriterSpec *this,Action *action)

{
  ActionType AVar1;
  InvokeAction *pIVar2;
  char *s;
  string_view s_00;
  
  WriteKey(this,"action");
  Stream::Writef(this->json_stream_,"{");
  WriteKey(this,"type");
  if (action->type_ == Invoke) {
    s = "invoke";
  }
  else {
    if (action->type_ != Get) {
      __assert_fail("action.type() == ActionType::Get",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer-spec.cc"
                    ,0x151,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteAction(const Action &)"
                   );
    }
    s = "get";
  }
  WriteString(this,s);
  WriteSeparator(this);
  if ((action->module_var).type_ == Name) {
    WriteKey(this,"module");
    WriteVar(this,&action->module_var);
    WriteSeparator(this);
  }
  AVar1 = action->type_;
  WriteKey(this,"field");
  s_00._M_str = (action->name)._M_dataplus._M_p;
  s_00._M_len = (action->name)._M_string_length;
  WriteEscapedString(this,s_00);
  if (AVar1 == Invoke) {
    WriteSeparator(this);
    WriteKey(this,"args");
    pIVar2 = cast<wabt::InvokeAction,wabt::Action>(action);
    WriteConstVector(this,&pIVar2->args);
  }
  Stream::Writef(this->json_stream_,"}");
  return;
}

Assistant:

void BinaryWriterSpec::WriteAction(const Action& action) {
  WriteKey("action");
  json_stream_->Writef("{");
  WriteKey("type");
  if (action.type() == ActionType::Invoke) {
    WriteString("invoke");
  } else {
    assert(action.type() == ActionType::Get);
    WriteString("get");
  }
  WriteSeparator();
  if (action.module_var.is_name()) {
    WriteKey("module");
    WriteVar(action.module_var);
    WriteSeparator();
  }
  if (action.type() == ActionType::Invoke) {
    WriteKey("field");
    WriteEscapedString(action.name);
    WriteSeparator();
    WriteKey("args");
    WriteConstVector(cast<InvokeAction>(&action)->args);
  } else {
    WriteKey("field");
    WriteEscapedString(action.name);
  }
  json_stream_->Writef("}");
}